

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

int VP8LDecodeHeader(VP8LDecoder *dec,VP8Io *io)

{
  int iVar1;
  int height;
  int width;
  int has_alpha;
  int local_2c;
  int local_28;
  int local_24;
  
  if (dec != (VP8LDecoder *)0x0) {
    if (io == (VP8Io *)0x0) {
      dec->status_ = VP8_STATUS_INVALID_PARAM;
    }
    else {
      dec->io_ = io;
      dec->status_ = VP8_STATUS_OK;
      VP8LInitBitReader(&dec->br_,io->data,io->data_size);
      iVar1 = ReadImageInfo(&dec->br_,&local_28,&local_2c,&local_24);
      if (iVar1 == 0) {
        dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
      }
      else {
        dec->state_ = READ_DIM;
        io->width = local_28;
        io->height = local_2c;
        iVar1 = DecodeImageStream(local_28,local_2c,1,dec,(uint32_t **)0x0);
        if (iVar1 != 0) {
          return 1;
        }
      }
      VP8LClear(dec);
    }
  }
  return 0;
}

Assistant:

int VP8LDecodeHeader(VP8LDecoder* const dec, VP8Io* const io) {
  int width, height, has_alpha;

  if (dec == NULL) return 0;
  if (io == NULL) {
    dec->status_ = VP8_STATUS_INVALID_PARAM;
    return 0;
  }

  dec->io_ = io;
  dec->status_ = VP8_STATUS_OK;
  VP8LInitBitReader(&dec->br_, io->data, io->data_size);
  if (!ReadImageInfo(&dec->br_, &width, &height, &has_alpha)) {
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    goto Error;
  }
  dec->state_ = READ_DIM;
  io->width = width;
  io->height = height;

  if (!DecodeImageStream(width, height, 1, dec, NULL)) goto Error;
  return 1;

 Error:
  VP8LClear(dec);
  assert(dec->status_ != VP8_STATUS_OK);
  return 0;
}